

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_EditionDefaultsWithExtension_Test::TestBody
          (CommandLineInterfaceTest_EditionDefaultsWithExtension_Test *this)

{
  bool bVar1;
  Descriptor *pDVar2;
  FileDescriptor *pFVar3;
  char *pcVar4;
  FeatureSetDefaults_FeatureSetEditionDefault *pFVar5;
  FeatureSet *pFVar6;
  ConstType pTVar7;
  AssertHelper local_320;
  Message local_318;
  EnumFeature local_310;
  EnumFeature local_30c;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_12;
  Message local_2f0;
  EnumFeature local_2e8;
  EnumFeature local_2e4;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_11;
  Message local_2c8;
  EnumFeature local_2c0;
  EnumFeature local_2bc;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_10;
  Message local_2a0;
  EnumFeature local_298;
  EnumFeature local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar_9;
  Message local_278;
  EnumFeature local_270;
  EnumFeature local_26c;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_8;
  Message local_250;
  Edition local_248;
  Edition local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_7;
  Message local_228;
  Edition local_220;
  Edition local_21c;
  undefined1 local_218 [8];
  AssertionResult gtest_ar_6;
  Message local_200;
  Edition local_1f8;
  Edition local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_5;
  Message local_1d8;
  Edition local_1d0;
  Edition local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_4;
  Message local_1b0;
  Edition local_1a8;
  Edition local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_188;
  Message local_180;
  int local_178;
  int local_174;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_2;
  Message local_158;
  Edition local_150;
  Edition local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_1;
  Message local_130;
  Edition local_128;
  Edition local_124;
  undefined1 local_120 [8];
  AssertionResult gtest_ar;
  undefined1 local_100 [8];
  FeatureSetDefaults defaults;
  string local_c0;
  string local_a0;
  string_view local_80;
  string_view local_70 [2];
  string local_50;
  string_view local_30;
  string_view local_20;
  CommandLineInterfaceTest_EditionDefaultsWithExtension_Test *local_10;
  CommandLineInterfaceTest_EditionDefaultsWithExtension_Test *this_local;
  
  local_10 = this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_20,"google/protobuf/descriptor.proto");
  pDVar2 = DescriptorProto::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  FileDescriptor::DebugString_abi_cxx11_(&local_50,pFVar3);
  local_30 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,local_20,local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_70,"features.proto");
  pDVar2 = pb::TestFeatures::descriptor();
  pFVar3 = Descriptor::file(pDVar2);
  FileDescriptor::DebugString_abi_cxx11_(&local_a0,pFVar3);
  local_80 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_a0);
  CommandLineInterfaceTester::CreateTempFile
            ((CommandLineInterfaceTester *)this,local_70[0],local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "protocol_compiler --proto_path=$tmpdir --edition_defaults_out=$tmpdir/defaults --edition_defaults_maximum=99999_TEST_ONLY features.proto google/protobuf/descriptor.proto"
             ,(allocator<char> *)((long)&defaults.field_0 + 0x27));
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&defaults.field_0 + 0x27));
  CommandLineInterfaceTester::ExpectNoErrors((CommandLineInterfaceTester *)this);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"defaults");
  CommandLineInterfaceTest::ReadEditionDefaults
            ((FeatureSetDefaults *)local_100,&this->super_CommandLineInterfaceTest,
             stack0xfffffffffffffef0);
  local_124 = FeatureSetDefaults::minimum_edition((FeatureSetDefaults *)local_100);
  local_128 = EDITION_PROTO2;
  testing::internal::EqHelper::
  Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
            ((EqHelper *)local_120,"defaults.minimum_edition()","EDITION_PROTO2",&local_124,
             &local_128);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8ae,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_14c = FeatureSetDefaults::maximum_edition((FeatureSetDefaults *)local_100);
  local_150 = EDITION_99999_TEST_ONLY;
  testing::internal::EqHelper::
  Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
            ((EqHelper *)local_148,"defaults.maximum_edition()","EDITION_99999_TEST_ONLY",&local_14c
             ,&local_150);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8af,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_174 = FeatureSetDefaults::defaults_size((FeatureSetDefaults *)local_100);
  local_178 = 7;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_170,"defaults.defaults_size()","7",&local_174,&local_178);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
               ,0x8b0,pcVar4);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message(&local_180);
  }
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_3.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  if (gtest_ar_3.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,0);
    local_1a4 = FeatureSetDefaults_FeatureSetEditionDefault::edition(pFVar5);
    local_1a8 = EDITION_LEGACY;
    testing::internal::EqHelper::
    Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
              ((EqHelper *)local_1a0,"defaults.defaults(0).edition()","EDITION_LEGACY",&local_1a4,
               &local_1a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
    if (!bVar1) {
      testing::Message::Message(&local_1b0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b1,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_1b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,2);
    local_1cc = FeatureSetDefaults_FeatureSetEditionDefault::edition(pFVar5);
    local_1d0 = EDITION_2023;
    testing::internal::EqHelper::
    Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
              ((EqHelper *)local_1c8,"defaults.defaults(2).edition()","EDITION_2023",&local_1cc,
               &local_1d0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
    if (!bVar1) {
      testing::Message::Message(&local_1d8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b2,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1d8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_1d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,3);
    local_1f4 = FeatureSetDefaults_FeatureSetEditionDefault::edition(pFVar5);
    local_1f8 = EDITION_2024;
    testing::internal::EqHelper::
    Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
              ((EqHelper *)local_1f0,"defaults.defaults(3).edition()","EDITION_2024",&local_1f4,
               &local_1f8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
    if (!bVar1) {
      testing::Message::Message(&local_200);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b3,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_200);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_200);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,4);
    local_21c = FeatureSetDefaults_FeatureSetEditionDefault::edition(pFVar5);
    local_220 = EDITION_99997_TEST_ONLY;
    testing::internal::EqHelper::
    Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
              ((EqHelper *)local_218,"defaults.defaults(4).edition()","EDITION_99997_TEST_ONLY",
               &local_21c,&local_220);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
    if (!bVar1) {
      testing::Message::Message(&local_228);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_218);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_228);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
      testing::Message::~Message(&local_228);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,5);
    local_244 = FeatureSetDefaults_FeatureSetEditionDefault::edition(pFVar5);
    local_248 = EDITION_99998_TEST_ONLY;
    testing::internal::EqHelper::
    Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
              ((EqHelper *)local_240,"defaults.defaults(5).edition()","EDITION_99998_TEST_ONLY",
               &local_244,&local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8b5,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_250);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,0);
    pFVar6 = FeatureSetDefaults_FeatureSetEditionDefault::fixed_features(pFVar5);
    pTVar7 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar6,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    local_26c = pb::TestFeatures::file_feature(pTVar7);
    local_270 = VALUE1;
    testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
              ((EqHelper *)local_268,
               "defaults.defaults(0) .fixed_features() .GetExtension(pb::test) .file_feature()",
               "pb::EnumFeature::VALUE1",&local_26c,&local_270);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8ba,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_278);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,2);
    pFVar6 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(pFVar5);
    pTVar7 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar6,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    local_294 = pb::TestFeatures::file_feature(pTVar7);
    local_298 = VALUE3;
    testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
              ((EqHelper *)local_290,
               "defaults.defaults(2) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE3",&local_294,&local_298);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
    if (!bVar1) {
      testing::Message::Message(&local_2a0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8bf,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_2a0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
      testing::Message::~Message(&local_2a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,3);
    pFVar6 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(pFVar5);
    pTVar7 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar6,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    local_2bc = pb::TestFeatures::file_feature(pTVar7);
    local_2c0 = VALUE3;
    testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
              ((EqHelper *)local_2b8,
               "defaults.defaults(3) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE3",&local_2bc,&local_2c0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8c4,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
      testing::Message::~Message(&local_2c8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,4);
    pFVar6 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(pFVar5);
    pTVar7 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar6,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    local_2e4 = pb::TestFeatures::file_feature(pTVar7);
    local_2e8 = VALUE4;
    testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
              ((EqHelper *)local_2e0,
               "defaults.defaults(4) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE4",&local_2e4,&local_2e8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8c9,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
      testing::Message::~Message(&local_2f0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
    pFVar5 = FeatureSetDefaults::defaults((FeatureSetDefaults *)local_100,5);
    pFVar6 = FeatureSetDefaults_FeatureSetEditionDefault::overridable_features(pFVar5);
    pTVar7 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false,_0>
                       (pFVar6,(ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                                *)pb::test);
    local_30c = pb::TestFeatures::file_feature(pTVar7);
    local_310 = VALUE5;
    testing::internal::EqHelper::Compare<pb::EnumFeature,_pb::EnumFeature,_nullptr>
              ((EqHelper *)local_308,
               "defaults.defaults(5) .overridable_features() .GetExtension(pb::test) .file_feature()"
               ,"pb::EnumFeature::VALUE5",&local_30c,&local_310);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_unittest.cc"
                 ,0x8ce,pcVar4);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message(&local_318);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
    gtest_ar_3.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  FeatureSetDefaults::~FeatureSetDefaults((FeatureSetDefaults *)local_100);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, EditionDefaultsWithExtension) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("features.proto",
                 pb::TestFeatures::descriptor()->file()->DebugString());
  Run("protocol_compiler --proto_path=$tmpdir "
      "--edition_defaults_out=$tmpdir/defaults "
      "--edition_defaults_maximum=99999_TEST_ONLY "
      "features.proto google/protobuf/descriptor.proto");
  ExpectNoErrors();

  FeatureSetDefaults defaults = ReadEditionDefaults("defaults");
  EXPECT_EQ(defaults.minimum_edition(), EDITION_PROTO2);
  EXPECT_EQ(defaults.maximum_edition(), EDITION_99999_TEST_ONLY);
  ASSERT_EQ(defaults.defaults_size(), 7);
  EXPECT_EQ(defaults.defaults(0).edition(), EDITION_LEGACY);
  EXPECT_EQ(defaults.defaults(2).edition(), EDITION_2023);
  EXPECT_EQ(defaults.defaults(3).edition(), EDITION_2024);
  EXPECT_EQ(defaults.defaults(4).edition(), EDITION_99997_TEST_ONLY);
  EXPECT_EQ(defaults.defaults(5).edition(), EDITION_99998_TEST_ONLY);
  EXPECT_EQ(defaults.defaults(0)
                .fixed_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE1);
  EXPECT_EQ(defaults.defaults(2)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE3);
  EXPECT_EQ(defaults.defaults(3)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE3);
  EXPECT_EQ(defaults.defaults(4)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE4);
  EXPECT_EQ(defaults.defaults(5)
                .overridable_features()
                .GetExtension(pb::test)
                .file_feature(),
            pb::EnumFeature::VALUE5);
}